

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
ExemptionSearchIRCCommand::trigger
          (ExemptionSearchIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  byte bVar1;
  uint64_t uVar2;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  bool bVar3;
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
  *this_00;
  size_type sVar4;
  const_reference this_01;
  tm *__tp;
  char *pcVar5;
  size_type sVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  size_type sVar10;
  char *pcVar11;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  size_t sVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  string local_458;
  __sv_type local_438;
  size_t local_428;
  char *pcStack_420;
  basic_string_view<char,_std::char_traits<char>_> local_418;
  size_t local_408;
  char *pcStack_400;
  __sv_type local_3f8;
  size_t local_3e8;
  char *pcStack_3e0;
  string local_3d8;
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  basic_string_view<char,_std::char_traits<char>_> local_388;
  basic_string_view<char,_std::char_traits<char>_> local_378;
  undefined1 local_368 [8];
  string ip_str;
  time_t current_time;
  size_t i;
  char timeStr [256];
  string types;
  string out;
  string_view type_str;
  undefined1 auStack_110 [4];
  uint type;
  pointer *local_108;
  string_view *local_100;
  undefined1 local_f8 [8];
  function<bool_(unsigned_int)> isMatch;
  string_view params;
  pointer local_c0;
  Entry *entry;
  size_t local_a8;
  char *pcStack_a0;
  undefined1 auStack_90 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char *local_68;
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
  *entries;
  IRC_Bot *source_local;
  ExemptionSearchIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)channel._M_str;
  pcVar13 = nick._M_str;
  sVar12 = nick._M_len;
  this_00 = (vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
             *)RenX::ExemptionDatabase::getEntries();
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar3) {
    local_428 = sVar12;
    pcStack_420 = pcVar13;
    sVar4 = std::
            vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
            ::size(this_00);
    string_printf_abi_cxx11_
              (&local_458,"There are a total of %u entries in the exemption database.",sVar4);
    local_438 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_458);
    Jupiter::IRC::Client::sendNotice(source,local_428,pcStack_420,local_438._M_len,local_438._M_str)
    ;
    std::__cxx11::string::~string((string *)&local_458);
    return;
  }
  sVar4 = std::
          vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
          ::size(this_00);
  if (sVar4 == 0) {
    join_0x00000010_0x00000000_ = sv("The exemption database is empty!",0x20);
    Jupiter::IRC::Client::sendNotice(source,sVar12,pcVar13,command_split.second._M_str,local_68);
    return;
  }
  local_a8 = parameters._M_len;
  pcStack_a0 = parameters._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&entry," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)auStack_90,(jessilib *)&local_a8,
             (basic_string_view<char,_std::char_traits<char>_> *)&entry,in_whitespace);
  isMatch._M_invoker = (_Invoker_type)command_split.first._M_str;
  _auStack_110 = (function<bool_(unsigned_int)> *)local_f8;
  local_108 = &local_c0;
  local_100 = (string_view *)&isMatch._M_invoker;
  std::function<bool(unsigned_int)>::
  function<ExemptionSearchIRCCommand::trigger(IRC_Bot*,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
            ((function<bool(unsigned_int)> *)_auStack_110,(anon_class_24_3_b2077666 *)auStack_110);
  bVar14 = sv("all",3);
  bVar15._M_str = (char *)command_split.first._M_len;
  bVar15._M_len = (size_t)auStack_90;
  bVar3 = jessilib::equalsi<char,char>(bVar15,bVar14);
  if (!bVar3) {
    bVar15 = sv("*",1);
    bVar14._M_str = (char *)command_split.first._M_len;
    bVar14._M_len = (size_t)auStack_90;
    bVar3 = std::operator==(bVar14,bVar15);
    if (!bVar3) {
      bVar15 = sv("ip",2);
      lhs_02._M_str = (char *)command_split.first._M_len;
      lhs_02._M_len = (size_t)auStack_90;
      bVar3 = jessilib::equalsi<char,char>(lhs_02,bVar15);
      if (bVar3) {
        type_str._M_str._4_4_ = 2;
      }
      else {
        bVar15 = sv("steam",5);
        lhs_01._M_str = (char *)command_split.first._M_len;
        lhs_01._M_len = (size_t)auStack_90;
        bVar3 = jessilib::equalsi<char,char>(lhs_01,bVar15);
        if (bVar3) {
          type_str._M_str._4_4_ = 3;
        }
        else {
          bVar15 = sv("setter",6);
          lhs_00._M_str = (char *)command_split.first._M_len;
          lhs_00._M_len = (size_t)auStack_90;
          bVar3 = jessilib::equalsi<char,char>(lhs_00,bVar15);
          if (bVar3) {
            type_str._M_str._4_4_ = 4;
          }
          else {
            bVar15 = sv("active",6);
            lhs._M_str = (char *)command_split.first._M_len;
            lhs._M_len = (size_t)auStack_90;
            bVar3 = jessilib::equalsi<char,char>(lhs,bVar15);
            if (bVar3) {
              type_str._M_str._4_4_ = 5;
            }
            else {
              type_str._M_str._4_4_ = 0;
              isMatch._M_invoker = (_Invoker_type)parameters._M_len;
            }
          }
        }
      }
      goto LAB_00150949;
    }
  }
  type_str._M_str._4_4_ = 1;
LAB_00150949:
  std::__cxx11::string::string((string *)(types.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(timeStr + 0xf8));
  for (current_time = 0;
      sVar4 = std::
              vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
              ::size(this_00), current_time != sVar4; current_time = current_time + 1) {
    this_01 = std::
              vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
              ::operator[](this_00,current_time);
    local_c0 = std::
               unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
               ::get(this_01);
    bVar3 = std::function<bool_(unsigned_int)>::operator()
                      ((function<bool_(unsigned_int)> *)local_f8,type_str._M_str._4_4_);
    if (bVar3) {
      ip_str.field_2._8_8_ = std::chrono::_V2::system_clock::to_time_t(&local_c0->timestamp);
      Jupiter::Socket::ntop4_abi_cxx11_((uint)local_368);
      __tp = localtime((time_t *)(ip_str.field_2._M_local_buf + 8));
      strftime((char *)&i,0x100,"%b %d %Y, %H:%M:%S",__tp);
      if (local_c0->flags == '\0') {
        local_378 = sv(" NULL;",6);
        std::__cxx11::string::operator=((string *)(timeStr + 0xf8),&local_378);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (timeStr + 0xf8));
        bVar3 = RenX::ExemptionDatabase::Entry::is_type_kick(local_c0);
        if (bVar3) {
          local_388 = sv(" kick",5);
          std::__cxx11::string::operator+=((string *)(timeStr + 0xf8),&local_388);
        }
        bVar3 = RenX::ExemptionDatabase::Entry::is_type_ban(local_c0);
        if (bVar3) {
          local_398 = sv(" ban",4);
          std::__cxx11::string::operator+=((string *)(timeStr + 0xf8),&local_398);
        }
        bVar3 = RenX::ExemptionDatabase::Entry::is_ip_exemption(local_c0);
        if (bVar3) {
          local_3a8 = sv(" ip",3);
          std::__cxx11::string::operator+=((string *)(timeStr + 0xf8),&local_3a8);
        }
        local_3b8 = sv(";",1);
        std::__cxx11::string::operator+=((string *)(timeStr + 0xf8),&local_3b8);
      }
      bVar3 = RenX::ExemptionDatabase::Entry::is_active(local_c0);
      pcVar5 = "in";
      if (bVar3) {
        pcVar5 = "";
      }
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_368);
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_368);
      bVar1 = local_c0->prefix_length;
      uVar2 = local_c0->steamid;
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (timeStr + 0xf8));
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (timeStr + 0xf8));
      sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (&local_c0->setter);
      pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data(&local_c0->setter);
      string_printf_abi_cxx11_
                (&local_3d8,
                 "ID: %lu (%sactive); Date: %s; IP: %.*s/%u; Steam: %llu; Types:%.*s Setter: %.*s",
                 current_time,pcVar5,&i,sVar6,pcVar7,(uint)bVar1,uVar2,sVar8,pcVar9,sVar10,pcVar11);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (types.field_2._M_local_buf + 8),&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      local_3e8 = sVar12;
      pcStack_3e0 = pcVar13;
      local_3f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(types.field_2._M_local_buf + 8));
      Jupiter::IRC::Client::sendNotice
                (source,local_3e8,pcStack_3e0,local_3f8._M_len,local_3f8._M_str);
      std::__cxx11::string::~string((string *)local_368);
    }
  }
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&types.field_2 + 8));
  if (bVar3) {
    local_408 = sVar12;
    pcStack_400 = pcVar13;
    local_418 = sv("No matches found.",0x11);
    Jupiter::IRC::Client::sendNotice(source,local_408,pcStack_400,local_418._M_len,local_418._M_str)
    ;
  }
  std::__cxx11::string::~string((string *)(timeStr + 0xf8));
  std::__cxx11::string::~string((string *)(types.field_2._M_local_buf + 8));
  std::function<bool_(unsigned_int)>::~function((function<bool_(unsigned_int)> *)local_f8);
  return;
}

Assistant:

void ExemptionSearchIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	const auto& entries = RenX::exemptionDatabase->getEntries();
	if (!parameters.empty())
	{
		if (entries.size() == 0) {
			source->sendNotice(nick, "The exemption database is empty!"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);

			RenX::ExemptionDatabase::Entry *entry;
			std::string_view params = command_split.second;
			std::function<bool(unsigned int)> isMatch = [&](unsigned int type_l) -> bool {
				switch (type_l)
				{
				default:
				case 0:	// ANY
					return isMatch(1) || isMatch(2) || isMatch(3) || isMatch(4);
				case 1: // ALL
					return true;
				case 2:	// IP
					return entry->ip == Jupiter::asUnsignedInt(params);
				case 3:	// STEAM
					return entry->steamid == Jupiter::asUnsignedLongLong(params);
				case 4:	// SETTER
					return jessilib::equalsi(entry->setter, params);
				case 5:	// ACTIVE
					return entry->is_active() == Jupiter::asBool(params);
				}
			};

			unsigned int type;
			std::string_view type_str = command_split.first;
			if (jessilib::equalsi(type_str, "all"sv) || type_str == "*"sv)
				type = 1;
			else if (jessilib::equalsi(type_str, "ip"sv))
				type = 2;
			else if (jessilib::equalsi(type_str, "steam"sv))
				type = 3;
			else if (jessilib::equalsi(type_str, "setter"sv))
				type = 4;
			else if (jessilib::equalsi(type_str, "active"sv))
				type = 5;
			else {
				type = 0;
				params = parameters;
			}

			std::string out;
			std::string types;
			char timeStr[256];
			for (size_t i = 0; i != entries.size(); i++)
			{
				entry = entries[i].get();
				if (isMatch(type))
				{
					time_t current_time = std::chrono::system_clock::to_time_t(entry->timestamp);
					std::string ip_str = Jupiter::Socket::ntop4(entry->ip);
					strftime(timeStr, sizeof(timeStr), "%b %d %Y, %H:%M:%S", localtime(&current_time));

					if ((entry->flags & 0xFF) == 0)
						types = " NULL;"sv;
					else
					{
						types.clear();
						if (entry->is_type_kick())
							types += " kick"sv;
						if (entry->is_type_ban())
							types += " ban"sv;
						if (entry->is_ip_exemption())
							types += " ip"sv;
						types += ";"sv;
					}

					out = string_printf("ID: %lu (%sactive); Date: %s; IP: %.*s/%u; Steam: %llu; Types:%.*s Setter: %.*s",
						i, entry->is_active() ? "" : "in", timeStr, ip_str.size(), ip_str.data(), entry->prefix_length, entry->steamid,
						types.size(), types.data(), entry->setter.size(), entry->setter.data());

					source->sendNotice(nick, out);
				}
			}
			if (out.empty())
				source->sendNotice(nick, "No matches found."sv);
		}
	}
	else
		source->sendNotice(nick, string_printf("There are a total of %u entries in the exemption database.", entries.size()));
}